

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O3

void If_CutRotatePins(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  word *pTruth;
  word *pwVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  Vec_Mem_t *pVVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  float t;
  float fVar12;
  float fVar13;
  float PinDelays [32];
  float local_98 [34];
  
  if (p->pPars->fUseTtPerm != 0) {
    __assert_fail("!p->pPars->fUseTtPerm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTruth.c"
                  ,0x48,"void If_CutRotatePins(If_Man_t *, If_Cut_t *)");
  }
  uVar11 = *(uint *)&pCut->field_0x1c;
  uVar9 = uVar11 >> 0x18;
  uVar7 = (ulong)uVar9;
  if (0xffffff < uVar11) {
    pVVar2 = p->vObjs;
    uVar10 = 0;
    do {
      fVar12 = (&pCut[1].Area)[uVar10];
      if (((long)(int)fVar12 < 0) || (pVVar2->nSize <= (int)fVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pVVar2->pArray[(int)fVar12];
      if (pvVar3 == (void *)0x0) break;
      local_98[uVar10] = *(float *)((long)pvVar3 + 0x5c);
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  pVVar8 = p->vTtMem[uVar7];
  if (pVVar8 == (Vec_Mem_t *)0x0) {
    if (0x1ffffff < uVar11) {
      do {
        uVar7 = 0;
        bVar5 = false;
        fVar12 = local_98[0];
        do {
          fVar13 = local_98[uVar7 + 1];
          if (fVar12 < fVar13) {
            local_98[uVar7] = fVar13;
            local_98[uVar7 + 1] = fVar12;
            *(ulong *)(&pCut[1].Area + uVar7) =
                 CONCAT44((int)*(undefined8 *)(&pCut[1].Area + uVar7),
                          (int)((ulong)*(undefined8 *)(&pCut[1].Area + uVar7) >> 0x20));
            bVar5 = true;
            fVar13 = fVar12;
          }
          uVar7 = uVar7 + 1;
          fVar12 = fVar13;
        } while (uVar9 - 1 != uVar7);
      } while (bVar5);
    }
  }
  else {
    if (pCut->iCutFunc < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar11 = (uint)pCut->iCutFunc >> 1;
    if (pVVar8->nEntries <= (int)uVar11) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pTruth = p->puTempW;
    iVar6 = p->nTruth6Words[uVar7];
    if (0 < (long)iVar6) {
      uVar9 = pVVar8->PageMask;
      iVar1 = pVVar8->nEntrySize;
      pwVar4 = pVVar8->ppPages[uVar11 >> ((byte)pVVar8->LogPageSze & 0x1f)];
      pVVar8 = (Vec_Mem_t *)0x0;
      do {
        pTruth[(long)pVVar8] = pwVar4[(long)pVVar8 + (long)(int)((uVar11 & uVar9) * iVar1)];
        pVVar8 = (Vec_Mem_t *)((long)pVVar8 + 1);
      } while ((Vec_Mem_t *)(long)iVar6 != pVVar8);
      uVar7 = (ulong)(byte)pCut->field_0x1f;
      uVar9 = (uint)(byte)pCut->field_0x1f;
    }
    If_CutTruthPermute(pTruth,uVar9,(int)pVVar8,p->nTruth6Words[uVar7],local_98,(int *)(pCut + 1));
    iVar6 = Vec_MemHashInsert(p->vTtMem[(byte)pCut->field_0x1f],p->puTempW);
    if (pCut->iCutFunc < 0) {
      __assert_fail("pCut->iCutFunc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/if.h"
                    ,0x1b5,"int If_CutTruthIsCompl(If_Cut_t *)");
    }
    if (iVar6 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    pCut->iCutFunc = (pCut->iCutFunc & 1U) + iVar6 * 2;
    if ((*p->puTempW & 1) != 0) {
      __assert_fail("(p->puTempW[0] & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTruth.c"
                    ,0x54,"void If_CutRotatePins(If_Man_t *, If_Cut_t *)");
    }
  }
  return;
}

Assistant:

void If_CutRotatePins( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float PinDelays[IF_MAX_LUTSIZE];
    int i, truthId;
    assert( !p->pPars->fUseTtPerm );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        PinDelays[i] = If_ObjCutBest(pLeaf)->Delay;
    if ( p->vTtMem[pCut->nLeaves] == NULL )
    {
        If_CutTruthPermute( NULL, If_CutLeaveNum(pCut), pCut->nLeaves, p->nTruth6Words[pCut->nLeaves], PinDelays, If_CutLeaves(pCut) );
        return;
    }
    Abc_TtCopy( p->puTempW, If_CutTruthWR(p, pCut), p->nTruth6Words[pCut->nLeaves], 0 );
    If_CutTruthPermute( p->puTempW, If_CutLeaveNum(pCut), pCut->nLeaves, p->nTruth6Words[pCut->nLeaves], PinDelays, If_CutLeaves(pCut) );
    truthId        = Vec_MemHashInsert( p->vTtMem[pCut->nLeaves], p->puTempW );
    pCut->iCutFunc = Abc_Var2Lit( truthId, If_CutTruthIsCompl(pCut) );
    assert( (p->puTempW[0] & 1) == 0 );
}